

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLElement * __thiscall tinyxml2::XMLNode::NextSiblingElement(XMLNode *this,char *name)

{
  XMLElement *pXVar1;
  
  do {
    this = this->_next;
    if (this == (XMLNode *)0x0) {
      return (XMLElement *)0x0;
    }
    pXVar1 = ToElementWithName(this,name);
  } while (pXVar1 == (XMLElement *)0x0);
  return pXVar1;
}

Assistant:

const XMLElement* XMLNode::NextSiblingElement( const char* name ) const
{
    for( const XMLNode* node = _next; node; node = node->_next ) {
        const XMLElement* element = node->ToElementWithName( name );
        if ( element ) {
            return element;
        }
    }
    return 0;
}